

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_list_switch_to_workspace(natwm_state *state,size_t index)

{
  workspace *next_workspace_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar1;
  workspace *next_workspace;
  size_t index_local;
  natwm_state *state_local;
  
  uVar1 = 0x10dd25;
  next_workspace_00 = workspace_list_get_workspace(state->workspace_list,index);
  if (next_workspace_00 == (workspace *)0x0) {
    internal_logger(natwm_logger,LEVEL_WARNING,"Attempted to switch to non-existent workspace %u",
                    index,in_R8,in_R9,uVar1);
    state_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else if ((next_workspace_00->is_focused & 1U) == 0) {
    state_local._4_4_ = workspace_change_monitor(state,next_workspace_00);
  }
  else {
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_list_switch_to_workspace(struct natwm_state *state, size_t index)
{
        struct workspace *next_workspace
                = workspace_list_get_workspace(state->workspace_list, index);

        if (!next_workspace) {
                LOG_WARNING(
                        natwm_logger, "Attempted to switch to non-existent workspace %u", index);

                return INVALID_INPUT_ERROR;
        }

        if (next_workspace->is_focused) {
                return NO_ERROR;
        }

        return workspace_change_monitor(state, next_workspace);
}